

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGhostObject.cpp
# Opt level: O2

void __thiscall
cbtGhostObject::removeOverlappingObjectInternal
          (cbtGhostObject *this,cbtBroadphaseProxy *otherProxy,cbtDispatcher *dispatcher,
          cbtBroadphaseProxy *thisProxy)

{
  int iVar1;
  cbtCollisionObject **ppcVar2;
  int iVar3;
  cbtCollisionObject *otherObject;
  cbtCollisionObject *local_10;
  
  local_10 = (cbtCollisionObject *)otherProxy->m_clientObject;
  iVar3 = cbtAlignedObjectArray<cbtCollisionObject_*>::findLinearSearch
                    (&this->m_overlappingObjects,&local_10);
  iVar1 = (this->m_overlappingObjects).m_size;
  if (iVar3 < iVar1) {
    ppcVar2 = (this->m_overlappingObjects).m_data;
    ppcVar2[iVar3] = ppcVar2[(long)iVar1 + -1];
    (this->m_overlappingObjects).m_size = iVar1 + -1;
  }
  return;
}

Assistant:

void cbtGhostObject::removeOverlappingObjectInternal(cbtBroadphaseProxy* otherProxy, cbtDispatcher* dispatcher, cbtBroadphaseProxy* thisProxy)
{
	cbtCollisionObject* otherObject = (cbtCollisionObject*)otherProxy->m_clientObject;
	cbtAssert(otherObject);
	int index = m_overlappingObjects.findLinearSearch(otherObject);
	if (index < m_overlappingObjects.size())
	{
		m_overlappingObjects[index] = m_overlappingObjects[m_overlappingObjects.size() - 1];
		m_overlappingObjects.pop_back();
	}
}